

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

bool GUIComponentLoad(string *path,
                     vector<GUIComponent,_std::allocator<GUIComponent>_> *out_components)

{
  char cVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  float x;
  float y;
  float z;
  float w;
  GUIComponent comp;
  string uniformName;
  string type;
  string line;
  ifstream file;
  istringstream iss;
  float local_47c;
  float local_478;
  float local_474;
  float local_46c;
  undefined1 local_468 [8];
  _Alloc_hider _Stack_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_450;
  undefined8 uStack_440;
  undefined8 local_438;
  float afStack_430 [6];
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8;
  undefined7 uStack_3c7;
  long local_3b8 [65];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream((istream *)local_3b8,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_3d8 = &local_3c8;
    local_3d0 = 0;
    local_3c8 = 0;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) +
                              (char)(istream *)local_3b8);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b8,(string *)&local_3d8,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d8,_S_in);
      local_418 = &local_408;
      local_410 = 0;
      local_408 = 0;
      local_3f8 = &local_3e8;
      local_3f0 = 0;
      local_3e8 = 0;
      piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_418);
      std::operator>>(piVar4,(string *)&local_3f8);
      local_458 = 0;
      aStack_450._M_allocated_capacity = 0;
      aStack_450._8_8_ = 0;
      uStack_440 = 0;
      local_438 = 0;
      afStack_430[0] = 0.0;
      afStack_430[1] = 0.0;
      local_468 = (undefined1  [8])0x0;
      _Stack_460._M_p = (pointer)0x0;
      afStack_430[2] = 0.0;
      afStack_430[3] = 0.0;
      iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
      if (iVar3 == 0) {
        std::istream::_M_extract<float>((float *)local_1b0);
        local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffff00000000);
        std::__cxx11::string::_M_assign((string *)&_Stack_460);
        local_438._4_4_ = local_47c;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
        if (iVar3 == 0) {
          piVar4 = std::istream::_M_extract<float>((float *)local_1b0);
          std::istream::_M_extract<float>((float *)piVar4);
          local_468._0_4_ = 1;
          std::__cxx11::string::_M_assign((string *)&_Stack_460);
          local_438._4_4_ = local_47c;
          afStack_430[0] = local_478;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
          if (iVar3 == 0) {
            piVar4 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar4 = std::istream::_M_extract<float>((float *)piVar4);
            std::istream::_M_extract<float>((float *)piVar4);
            local_468._0_4_ = 2;
            std::__cxx11::string::_M_assign((string *)&_Stack_460);
LAB_0010cd84:
            local_438._4_4_ = local_47c;
            afStack_430[1] = local_474;
            afStack_430[0] = local_478;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
            if (iVar3 == 0) {
              piVar4 = std::istream::_M_extract<float>((float *)local_1b0);
              piVar4 = std::istream::_M_extract<float>((float *)piVar4);
              piVar4 = std::istream::_M_extract<float>((float *)piVar4);
              std::istream::_M_extract<float>((float *)piVar4);
              local_468._0_4_ = 3;
              std::__cxx11::string::_M_assign((string *)&_Stack_460);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
              if (iVar3 == 0) {
                piVar4 = std::istream::_M_extract<float>((float *)local_1b0);
                piVar4 = std::istream::_M_extract<float>((float *)piVar4);
                std::istream::_M_extract<float>((float *)piVar4);
                local_468._0_4_ = 4;
                std::__cxx11::string::_M_assign((string *)&_Stack_460);
                goto LAB_0010cd84;
              }
              iVar3 = std::__cxx11::string::compare((char *)&local_3f8);
              if (iVar3 != 0) goto LAB_0010cda8;
              piVar4 = std::istream::_M_extract<float>((float *)local_1b0);
              piVar4 = std::istream::_M_extract<float>((float *)piVar4);
              piVar4 = std::istream::_M_extract<float>((float *)piVar4);
              std::istream::_M_extract<float>((float *)piVar4);
              local_468._0_4_ = 5;
              std::__cxx11::string::_M_assign((string *)&_Stack_460);
            }
            local_438._4_4_ = local_47c;
            afStack_430[1] = local_474;
            afStack_430[0] = local_478;
            afStack_430[2] = local_46c;
          }
        }
      }
LAB_0010cda8:
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back
                (out_components,(value_type *)local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_460._M_p != &aStack_450) {
        operator_delete(_Stack_460._M_p,aStack_450._M_allocated_capacity + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
      }
      if (local_418 != &local_408) {
        operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
    }
    std::ifstream::close();
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return (bool)cVar1;
}

Assistant:

bool GUIComponentLoad(const std::string& path, std::vector<GUIComponent>& out_components) {
    std::ifstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    std::string line;
    while (std::getline(file, line)) {
        std::istringstream iss(line);
        std::string uniformName;
        std::string type;
        iss >> uniformName >> type;
        GUIComponent comp;
        if (type == "s1") {
            float value;
            iss >> value;
            comp.Type = EGUIComponentTypeSlider1;
            comp.UniformName = uniformName;
            comp.Data[0] = value;
        } else if (type == "s2") {
            float x, y;
            iss >> x >> y;
            comp.Type = EGUIComponentTypeSlider2;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
        } else if (type == "s3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeSlider3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "s4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeSlider4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        } else if (type == "c3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeColor3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "c4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeColor4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        }
        out_components.push_back(comp);
    }
    
    file.close();
    return true;
}